

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O3

Vec3fa embree::MirrorMaterial__sample
                 (ISPCMirrorMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,DifferentialGeometry *dg
                 ,Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  float fVar7;
  Vec3fa VVar8;
  
  fVar2 = (float)dg->geomID;
  fVar3 = (float)dg->primID;
  fVar4 = dg->u;
  auVar1 = *(undefined1 (*) [16])wi_o[2].v.field_0.m128;
  VVar8.field_0._8_8_ = auVar1._0_8_;
  fVar7 = fVar3 * auVar1._8_4_ + fVar2 * auVar1._4_4_ + (float)dg->instIDs[0] * auVar1._0_4_;
  fVar7 = fVar7 + fVar7;
  (medium->transmission).field_0.m128[0] = fVar7 * auVar1._0_4_ - (float)dg->instIDs[0];
  (medium->transmission).field_0.m128[1] = fVar7 * auVar1._4_4_ - fVar2;
  (medium->transmission).field_0.m128[2] = fVar7 * auVar1._8_4_ - fVar3;
  (medium->transmission).field_0.m128[3] = fVar7 * auVar1._12_4_ - fVar4;
  medium->eta = 1.0;
  uVar5 = *(undefined8 *)&(brdf->Ka).field_0;
  uVar6 = *(undefined8 *)((long)&(brdf->Ka).field_0 + 8);
  (This->base).type = (int)uVar5;
  (This->base).align[0] = (int)((ulong)uVar5 >> 0x20);
  *(undefined8 *)((This->base).align + 1) = uVar6;
  VVar8.field_0._0_8_ = uVar5;
  return (Vec3fa)VVar8.field_0;
}

Assistant:

Vec3fa MirrorMaterial__sample(ISPCMirrorMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  wi_o = make_Sample3f(reflect(wo,dg.Ns),1.0f);
  return Vec3fa(This->reflectance);
}